

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O0

string * __thiscall flow::Value::to_string_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  LiteralType *in_R9;
  string_view format_str;
  basic_string_view<char> local_28;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_28,"Value {} of type {}");
  format_str.size_ = &this->name_;
  format_str.data_ = (char *)local_28.size_;
  fmt::v5::format<std::__cxx11::string,flow::LiteralType>
            (__return_storage_ptr__,(v5 *)local_28.data_,format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->type_,in_R9
            );
  return __return_storage_ptr__;
}

Assistant:

std::string Value::to_string() const {
  return fmt::format("Value {} of type {}", name_, type_);
}